

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memorypool.h
# Opt level: O0

void __thiscall
despot::MemoryPool<despot::ChainState>::~MemoryPool(MemoryPool<despot::ChainState> *this)

{
  MemoryPool<despot::ChainState> *this_local;
  
  DeleteAll(this);
  std::vector<despot::ChainState_*,_std::allocator<despot::ChainState_*>_>::~vector
            (&this->freelist_);
  std::
  vector<despot::MemoryPool<despot::ChainState>::Chunk_*,_std::allocator<despot::MemoryPool<despot::ChainState>::Chunk_*>_>
  ::~vector(&this->chunks_);
  return;
}

Assistant:

~MemoryPool() {
		DeleteAll();
	}